

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool __thiscall
GdlSetAttrItem::GenerateAttrSettingCode
          (GdlSetAttrItem *this,GrcManager *pcman,uint32_t fxdRuleVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int irit,int nIIndex)

{
  bool bVar1;
  size_type_conflict sVar2;
  long *in_RDI;
  size_t ipavs;
  bool fAttachForward;
  undefined4 in_stack_00000060;
  GdlAttrValueSpec *in_stack_00000078;
  int in_stack_00000090;
  ulong local_38;
  bool local_29;
  
  local_29 = false;
  for (local_38 = 0;
      sVar2 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                        ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                         (in_RDI + 0xf)), local_38 < sVar2; local_38 = local_38 + 1) {
    std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
              ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)(in_RDI + 0xf),
               local_38);
    (**(code **)(*in_RDI + 0xa8))();
    bVar1 = GdlAttrValueSpec::GenerateAttrSettingCode
                      (in_stack_00000078,(GrcManager *)this,pcman._4_4_,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(fxdRuleVersion,in_stack_00000060),vbOutput._4_4_,(int)vbOutput,
                       in_stack_00000090);
    if (bVar1) {
      local_29 = true;
    }
  }
  return local_29;
}

Assistant:

bool GdlSetAttrItem::GenerateAttrSettingCode(GrcManager * pcman, uint32_t fxdRuleVersion,
	std::vector<gr::byte> & vbOutput,
	int irit, int nIIndex)
{
	bool fAttachForward = false;
	for (size_t ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
	{
		if (m_vpavs[ipavs]->GenerateAttrSettingCode(pcman, fxdRuleVersion, vbOutput,
			irit, nIIndex, AttachTo()))
		{
			fAttachForward = true;
		}
	}
	return fAttachForward;
}